

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O0

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<long_double> *original_costs,
            double cost_constant)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  random_engine *rng_;
  result_type_conflict2 rVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  rep rVar9;
  pointer plVar10;
  pointer plVar11;
  reference sol;
  default_cost_type<long_double> *c;
  longdouble in_ST0;
  longdouble theta_00;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar14;
  longdouble in_ST5;
  double extraout_XMM0_Qa;
  double dVar15;
  double in_XMM1_Qa;
  longdouble local_268;
  uint local_228;
  int iter;
  int remaining_1;
  int push;
  int remaining;
  long i_1;
  string_view local_200;
  none_observer local_1e9;
  undefined1 auStack_1e8 [7];
  none_observer obs;
  longdouble kappa;
  int iStack_1c4;
  bool start_push;
  int e;
  int i;
  bit_array empty_x;
  bernoulli_distribution choose_mutation;
  compute_order compute;
  solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  slv;
  long w_limit;
  longdouble pushing_objective_amplifier;
  longdouble pushing_k_factor;
  longdouble delta;
  longdouble theta;
  longdouble alpha;
  longdouble kappa_max;
  longdouble kappa_step;
  default_cost_type<long_double> norm_costs;
  solver_parameters *p;
  int best_remaining;
  undefined1 local_50 [8];
  bit_array x;
  double cost_constant_local;
  default_cost_type<long_double> *original_costs_local;
  int variables_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  solver_functor<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>,_long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_baryonyx::none_observer>
  *this_local;
  result *r;
  
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ = 0;
  baryonyx::result::result(__return_storage_ptr__);
  bit_array::bit_array((bit_array *)local_50,variables);
  p._0_4_ = 0x7fffffff;
  norm_costs.linear_elements._M_t.
  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<long_double,_std::default_delete<long_double[]>,_true,_true>)this->m_ctx;
  c = (default_cost_type<long_double> *)this->m_rng;
  iVar8 = variables;
  normalize_costs<long_double,baryonyx::itm::default_cost_type<long_double>>
            ((itm *)((long)&kappa_step + 8),this->m_ctx,original_costs,(random_engine *)c,variables)
  ;
  dVar1 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                  super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0x20);
  dVar2 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                  super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0x28);
  theta_00 = (longdouble)
             *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                     super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 8);
  if (0.0 <= *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                     super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0x10)) {
    local_268 = (longdouble)
                *(double *)
                 ((long)norm_costs.linear_elements._M_t.
                        super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t
                        .super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                        super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0x10);
    lVar12 = in_ST0;
  }
  else {
    compute_delta<long_double,baryonyx::itm::default_cost_type<long_double>>
              ((longdouble *)this->m_ctx,(itm *)((long)&kappa_step + 8),
               (context *)(ulong)(uint)variables,c,theta_00,iVar8);
    lVar12 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    local_268 = in_ST0;
  }
  dVar3 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                  super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0x38);
  dVar4 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                  super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0x40);
  slv._120_8_ = (BADTYPE)*(double *)
                          ((long)norm_costs.linear_elements._M_t.
                                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                                 .super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xa0);
  rng_ = this->m_rng;
  iVar8 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (constraints);
  solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  ::solver_inequalities_01coeff
            ((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
              *)&compute.order,rng_,iVar8,variables,(cost_type *)((long)&kappa_step + 8),constraints
            );
  compute_order::compute_order
            ((compute_order *)&choose_mutation,
             *(constraint_order *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                     super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xcc),variables);
  std::bernoulli_distribution::bernoulli_distribution
            ((bernoulli_distribution *)&empty_x.super_bit_array_impl.m_data,
             (this->m_ctx->parameters).init_policy_random);
  bit_array::bit_array((bit_array *)&e);
  iVar8 = *(int *)((long)norm_costs.linear_elements._M_t.
                         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                         super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xd4);
  if (iVar8 == 0) {
    init_with_bastert<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)local_50,original_costs,variables,0);
  }
  else if (iVar8 == 1) {
    init_with_pre_solve<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)local_50,(bit_array *)&e,this->m_rng,original_costs,constraints,1.0);
  }
  else if (iVar8 == 2) {
    init_with_pre_solve<baryonyx::itm::default_cost_type<long_double>,baryonyx::itm::maximize_tag>
              ((bit_array *)&e,(bit_array *)local_50,this->m_rng,original_costs,constraints,1.0);
  }
  iStack_1c4 = 0;
  iVar8 = bit_array_impl::size((bit_array_impl *)local_50);
  for (; iStack_1c4 != iVar8; iStack_1c4 = iStack_1c4 + 1) {
    rVar5 = std::bernoulli_distribution::operator()
                      ((bernoulli_distribution *)&empty_x.super_bit_array_impl.m_data,this->m_rng);
    if (rVar5) {
      bit_array_impl::invert((bit_array_impl *)local_50,iStack_1c4);
    }
  }
  bit_array::~bit_array((bit_array *)&e);
  bVar7 = false;
  _auStack_1e8 = (longdouble)
                 *(double *)
                  ((long)norm_costs.linear_elements._M_t.
                         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                         super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0x18);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_200,"img");
  none_observer::none_observer
            (&local_1e9,local_200,(int)slv.c,slv.c._4_4_,
             *(long *)((long)norm_costs.linear_elements._M_t.
                             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                             .super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xb0));
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar9;
  rVar9 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar9;
  dVar15 = extraout_XMM0_Qa;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array>
            ((compute_order *)&choose_mutation,
             (solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
              *)&compute.order,(bit_array *)local_50);
  for (_push = 0;
      _push != *(long *)((long)norm_costs.linear_elements._M_t.
                               super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                               .super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xb0);
      _push = _push + 1) {
    lVar14 = in_ST4;
    iVar8 = compute_order::
            run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                      ((compute_order *)&choose_mutation,
                       (solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                        *)&compute.order,(bit_array *)local_50,this->m_rng,_auStack_1e8,local_268,
                       theta_00);
    plVar10 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                        ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)
                         &slv.ap.m_cols_values.m_length);
    plVar11 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                        ((unique_ptr<long_double[],_std::default_delete<long_double[]>_> *)&slv.b);
    none_observer::make_observation<long_double>
              (&local_1e9,(sparse_matrix<int> *)&slv.rng,plVar10,plVar11);
    if (iVar8 == 0) {
      dVar15 = default_cost_type<long_double>::results
                         (original_costs,(bit_array *)local_50,cost_constant);
      store_if_better(this,(bit_array *)local_50,dVar15,_push);
      bVar7 = true;
      break;
    }
    lVar13 = lVar12;
    if (iVar8 < (int)p) {
      store_if_better(this,(bit_array *)local_50,iVar8,_push);
      lVar13 = lVar12;
      p._0_4_ = iVar8;
    }
    lVar12 = lVar13;
    if ((long)slv._120_8_ < _push) {
      lVar12 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = lVar14;
      dVar15 = std::pow(dVar15,in_XMM1_Qa);
      _auStack_1e8 = _auStack_1e8 + (longdouble)dVar1 * lVar13;
    }
    if ((longdouble)dVar2 < _auStack_1e8) {
      __return_storage_ptr__->status = kappa_max_reached;
      break;
    }
    bVar6 = is_timelimit_reached(this);
    if (bVar6) {
      __return_storage_ptr__->status = time_limit_reached;
      break;
    }
  }
  if (bVar7) {
    for (iter = 0;
        iter < *(int *)((long)norm_costs.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xbc);
        iter = iter + 1) {
      lVar14 = in_ST3;
      iVar8 = compute_order::
              push_and_run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                        ((compute_order *)&choose_mutation,
                         (solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                          *)&compute.order,(bit_array *)local_50,this->m_rng,
                         _auStack_1e8 * (longdouble)dVar3,local_268,theta_00,(longdouble)dVar4);
      if (iVar8 == 0) {
        dVar15 = default_cost_type<long_double>::results
                           (original_costs,(bit_array *)local_50,cost_constant);
        store_if_better(this,(bit_array *)local_50,dVar15,
                        (long)(-iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                                                  .super__Head_base<0UL,_long_double_*,_false>.
                                                  _M_head_impl + 0xc0) + -1));
      }
      bVar7 = is_timelimit_reached(this);
      if (bVar7) break;
      for (local_228 = 0;
          (int)local_228 <
          *(int *)((long)norm_costs.linear_elements._M_t.
                         super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                         super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xc0);
          local_228 = local_228 + 1) {
        lVar13 = lVar14;
        iVar8 = compute_order::
                run<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,long_double>
                          ((compute_order *)&choose_mutation,
                           (solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                            *)&compute.order,(bit_array *)local_50,this->m_rng,_auStack_1e8,
                           local_268,theta_00);
        if (iVar8 == 0) {
          dVar15 = default_cost_type<long_double>::results
                             (original_costs,(bit_array *)local_50,cost_constant);
          store_if_better(this,(bit_array *)local_50,dVar15,
                          (long)(int)(~local_228 +
                                     -iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                                        
                                                  super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                                                  .super__Head_base<0UL,_long_double_*,_false>.
                                                  _M_head_impl + 0xc0)));
          break;
        }
        if (*(double *)
             ((long)norm_costs.linear_elements._M_t.
                    super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                    super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                    super__Head_base<0UL,_long_double_*,_false>._M_head_impl + 0xa0) <
            (double)(int)local_228) {
          std::pow((double)(int)local_228,in_XMM1_Qa);
          _auStack_1e8 = _auStack_1e8 + (longdouble)dVar1 * lVar12;
          lVar12 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = lVar14;
          lVar14 = lVar13;
        }
        if (((longdouble)dVar2 < _auStack_1e8) || (bVar7 = is_timelimit_reached(this), bVar7))
        break;
      }
    }
  }
  else {
    __return_storage_ptr__->status = limit_reached;
  }
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  bVar7 = bit_array_impl::empty((bit_array_impl *)&this->m_best);
  if (!bVar7) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    sol = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::operator[]
                    (&__return_storage_ptr__->solutions,0);
    convert<baryonyx::itm::maximize_tag>(&this->m_best,sol,variables);
  }
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ = 1;
  compute_order::~compute_order((compute_order *)&choose_mutation);
  solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
  ::~solver_inequalities_01coeff
            ((solver_inequalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
              *)&compute.order);
  default_cost_type<long_double>::~default_cost_type
            ((default_cost_type<long_double> *)((long)&kappa_step + 8));
  bit_array::~bit_array((bit_array *)local_50);
  if ((x.super_bit_array_impl.m_data._M_t.
       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl._7_1_ & 1) == 0) {
    baryonyx::result::~result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }